

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
DoSetProperty_NoFastPath<Js::OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)1>>const__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout,Var instance,
          PropertyOperationFlags flags)

{
  RootCacheId RVar1;
  bool bVar2;
  PropertyId PVar3;
  InlineCache *this_00;
  code *pcVar4;
  FunctionBody *pFVar5;
  Var pvVar6;
  ScriptFunction *this_01;
  ConstructorCache *this_02;
  ScriptContext *this_03;
  ThreadContext *threadContext;
  _func_void_FunctionBody_ptr_InlineCache_ptr_InlineCacheIndex_Var_PropertyId_Var_PropertyOperationFlags
  *PatchPut;
  _func_void_FunctionBody_ptr_InlineCache_ptr_InlineCacheIndex_Var_PropertyId_Var_PropertyOperationFlags
  *PatchPutValue;
  _func_void_FunctionBody_ptr_InlineCache_ptr_InlineCacheIndex_Var_PropertyId_Var_PropertyOperationFlags
  *PatchPutRootValue;
  InlineCache *inlineCache;
  PropertyOperationFlags flags_local;
  Var instance_local;
  OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(instance);
  this_00 = GetInlineCache(this,playout->inlineCacheIndex);
  pcVar4 = Js::JavascriptOperators::PatchPutValueNoLocalFastPath<false,Js::InlineCache>;
  if ((flags & PropertyOperation_Root) != PropertyOperation_None) {
    pcVar4 = Js::JavascriptOperators::PatchPutRootValueNoLocalFastPath<false,Js::InlineCache>;
  }
  pFVar5 = GetFunctionBody(this);
  RVar1 = playout->inlineCacheIndex;
  PVar3 = GetPropertyIdFromCacheId(this,playout->inlineCacheIndex);
  pvVar6 = GetReg<unsigned_short>(this,playout->Value);
  (*pcVar4)(pFVar5,this_00,RVar1,instance,PVar3,pvVar6,flags);
  bVar2 = TaggedNumber::Is(instance);
  if (!bVar2) {
    this_01 = GetJavascriptFunction(this);
    this_02 = JavascriptFunction::GetConstructorCache((JavascriptFunction *)this_01);
    bVar2 = ConstructorCache::NeedsUpdateAfterCtor(this_02);
    if (bVar2) {
      this_03 = GetScriptContext(this);
      threadContext = ScriptContext::GetThreadContext(this_03);
      InlineCache::RemoveFromInvalidationListAndClear(this_00,threadContext);
    }
  }
  return;
}

Assistant:

_NOINLINE void InterpreterStackFrame::DoSetProperty_NoFastPath(unaligned T* playout, Var instance, PropertyOperationFlags flags)
    {
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(instance);
#endif
        InlineCache *const inlineCache = GetInlineCache(playout->inlineCacheIndex);

        const auto PatchPutRootValue = &JavascriptOperators::PatchPutRootValueNoLocalFastPath<false, InlineCache>;
        const auto PatchPutValue = &JavascriptOperators::PatchPutValueNoLocalFastPath<false, InlineCache>;
        const auto PatchPut = flags & PropertyOperation_Root ? PatchPutRootValue : PatchPutValue;
        PatchPut(
            GetFunctionBody(),
            inlineCache,
            playout->inlineCacheIndex,
            instance,
            GetPropertyIdFromCacheId(playout->inlineCacheIndex),
            GetReg(playout->Value),
            flags);

        if (!TaggedNumber::Is(instance) && GetJavascriptFunction()->GetConstructorCache()->NeedsUpdateAfterCtor())
        {
            // This function has only 'this' statements and is being used as a constructor. When the constructor exits, the
            // function object's constructor cache will be updated with the type produced by the constructor. From that
            // point on, when the same function object is used as a constructor, the a new object with the final type will
            // be created. Whatever is stored in the inline cache currently will cause cache misses after the constructor
            // cache update. So, just clear it now so that the caches won't be flagged as polymorphic.
            inlineCache->RemoveFromInvalidationListAndClear(this->GetScriptContext()->GetThreadContext());
        }
    }